

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::VectorTest_MoveConstructor_Test::TestBody
          (VectorTest_MoveConstructor_Test *this)

{
  unsigned_long *orig_ptr;
  size_t sVar1;
  bool bVar2;
  pointer *__ptr;
  pointer *__ptr_1;
  char *message;
  char *in_R9;
  unsigned_long uVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  internal local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  Vector<unsigned_long> local_78;
  string local_58;
  AssertHelper local_38;
  
  local_78.data_ = (unsigned_long *)0x0;
  local_78.size_ = 0;
  local_78.capacity_ = 0;
  uVar3 = 0;
  do {
    bVar2 = Vector<unsigned_long>::MaybeGrow(&local_78);
    if (!bVar2) {
      local_88[0] = (internal)0x0;
      local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_58,local_88,(AssertionResult *)"vec.Push(i)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0x61,local_58._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      goto LAB_0031533a;
    }
    local_78.data_[local_78.size_] = uVar3;
    local_78.size_ = local_78.size_ + 1;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 100);
  OPENSSL_free((void *)0x0);
  local_58.field_2._M_allocated_capacity = local_78.capacity_;
  sVar1 = local_78.size_;
  orig_ptr = local_78.data_;
  local_58._M_dataplus._M_p = (pointer)local_78.data_;
  local_78.data_ = (unsigned_long *)0x0;
  local_78.size_ = 0;
  local_78.capacity_ = 0;
  local_58._M_string_length = sVar1;
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    if (sVar1 <= local_90._M_head_impl) {
      abort();
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_88,"vec_moved[i]","i",orig_ptr + (long)local_90._M_head_impl,
               (unsigned_long *)&local_90);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      message = "";
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0x66,message);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_98._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_98._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_90._M_head_impl = local_90._M_head_impl + 1;
  } while (local_90._M_head_impl <
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x64);
  OPENSSL_free(orig_ptr);
LAB_0031533a:
  OPENSSL_free(local_78.data_);
  return;
}

Assistant:

TEST(InplaceVectorTest, ComplexType) {
  InplaceVector<std::vector<int>, 4> vec_of_vecs;
  const std::vector<int> data[] = {{1, 2, 3}, {4, 5, 6}, {7, 8, 9}};
  vec_of_vecs.CopyFrom(data);
  EXPECT_EQ(Span(vec_of_vecs), Span(data));

  vec_of_vecs.Resize(2);
  EXPECT_EQ(Span(vec_of_vecs), Span(data, 2));

  vec_of_vecs.PushBack({42});
  EXPECT_EQ(3u, vec_of_vecs.size());
  vec_of_vecs.pop_back();
  EXPECT_EQ(2u, vec_of_vecs.size());

  vec_of_vecs.Resize(4);
  EXPECT_EQ(4u, vec_of_vecs.size());
  EXPECT_EQ(vec_of_vecs[0], data[0]);
  EXPECT_EQ(vec_of_vecs[1], data[1]);
  EXPECT_TRUE(vec_of_vecs[2].empty());
  EXPECT_TRUE(vec_of_vecs[3].empty());

  // Copy-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs2 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs2.size());
  EXPECT_EQ(vec_of_vecs2[0], data[0]);
  EXPECT_EQ(vec_of_vecs2[1], data[1]);
  EXPECT_TRUE(vec_of_vecs2[2].empty());
  EXPECT_TRUE(vec_of_vecs2[3].empty());

  // Copy-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs3;
  vec_of_vecs3 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs3.size());
  EXPECT_EQ(vec_of_vecs3[0], data[0]);
  EXPECT_EQ(vec_of_vecs3[1], data[1]);
  EXPECT_TRUE(vec_of_vecs3[2].empty());
  EXPECT_TRUE(vec_of_vecs3[3].empty());

  // Move-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs4 = std::move(vec_of_vecs);
  EXPECT_EQ(4u, vec_of_vecs4.size());
  EXPECT_EQ(vec_of_vecs4[0], data[0]);
  EXPECT_EQ(vec_of_vecs4[1], data[1]);
  EXPECT_TRUE(vec_of_vecs4[2].empty());
  EXPECT_TRUE(vec_of_vecs4[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs.size());
  for (const auto &vec : vec_of_vecs) {
    EXPECT_TRUE(vec.empty());
  }

  // Move-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs5;
  vec_of_vecs5 = std::move(vec_of_vecs4);
  EXPECT_EQ(4u, vec_of_vecs5.size());
  EXPECT_EQ(vec_of_vecs5[0], data[0]);
  EXPECT_EQ(vec_of_vecs5[1], data[1]);
  EXPECT_TRUE(vec_of_vecs5[2].empty());
  EXPECT_TRUE(vec_of_vecs5[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs4.size());
  for (const auto &vec : vec_of_vecs4) {
    EXPECT_TRUE(vec.empty());
  }

  std::vector<int> v = {42};
  vec_of_vecs5.Resize(3);
  EXPECT_TRUE(vec_of_vecs5.TryPushBack(v));
  EXPECT_EQ(v, vec_of_vecs5[3]);
  EXPECT_FALSE(vec_of_vecs5.TryPushBack(v));
}